

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

void Sfm_TimCriticalPath_int(Sfm_Tim_t *p,Abc_Obj_t *pObj,Vec_Int_t *vPath,int SlackMax)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pObj_00;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  int Fill;
  int iVar7;
  int iVar8;
  long lVar9;
  
  pAVar1 = pObj->pNtk;
  iVar7 = pObj->Id;
  Vec_IntFillExtra(&pAVar1->vTravIds,iVar7 + 1,(int)vPath);
  if (((long)iVar7 < 0) || ((pAVar1->vTravIds).nSize <= iVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar2 = pObj->pNtk;
  iVar8 = pAVar2->nTravIds;
  if ((pAVar1->vTravIds).pArray[iVar7] != iVar8) {
    iVar7 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar7 + 1,Fill);
    if (((long)iVar7 < 0) || ((pAVar2->vTravIds).nSize <= iVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar2->vTravIds).pArray[iVar7] = iVar8;
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                    ,0xa0,"void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)"
                   );
    }
    if (0 < (pObj->vFanins).nSize) {
      lVar9 = 0;
      do {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar9]];
        uVar5 = *(uint *)&pObj_00->field_0x14 & 0xf;
        if (((uVar5 != 2) && (uVar5 != 5)) && ((pObj_00->vFanins).nSize != 0)) {
          if (uVar5 != 7) {
            __assert_fail("Abc_ObjIsNode(pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                          ,0xa5,
                          "void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          uVar5 = pObj_00->Id;
          uVar6 = (ulong)uVar5;
          if ((int)uVar5 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          if (((p->vTimReqs).nSize <= (int)(uVar5 * 2)) || ((p->vTimArrs).nSize <= (int)(uVar5 * 2))
             ) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar3 = (p->vTimArrs).pArray;
          piVar4 = (p->vTimReqs).pArray;
          iVar8 = piVar4[uVar6 * 2] - piVar3[uVar6 * 2];
          iVar7 = piVar4[uVar6 * 2 + 1] - piVar3[uVar6 * 2 + 1];
          if (iVar8 < iVar7) {
            iVar7 = iVar8;
          }
          if (iVar7 <= SlackMax) {
            Sfm_TimCriticalPath_int(p,pObj_00,vPath,SlackMax);
          }
        }
        lVar9 = lVar9 + 1;
        iVar7 = (pObj->vFanins).nSize;
      } while (lVar9 < iVar7);
      if (0 < iVar7) {
        Vec_IntPush(vPath,pObj->Id);
        return;
      }
    }
  }
  return;
}

Assistant:

void Sfm_TimCriticalPath_int( Sfm_Tim_t * p, Abc_Obj_t * pObj, Vec_Int_t * vPath, int SlackMax )
{
    Abc_Obj_t * pNext; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pNext, i )
    {
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, vPath, SlackMax );
    }
    if ( Abc_ObjFaninNum(pObj) > 0 )
        Vec_IntPush( vPath, Abc_ObjId(pObj) );
}